

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O0

void __thiscall POSG::SetDiscount(POSG *this,Index agentI,double d)

{
  reference pvVar1;
  undefined8 uVar2;
  undefined4 in_ESI;
  char *in_XMM0_Qa;
  size_type in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((0.0 <= (double)in_XMM0_Qa) && ((double)in_XMM0_Qa <= 1.0)) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *pvVar1 = (value_type)in_XMM0_Qa;
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_XMM0_Qa);
  __cxa_throw(uVar2,&E::typeinfo,E::~E);
}

Assistant:

void POSG::SetDiscount(Index agentI, double d)
{
    if(d>=0 && d<=1)
        _m_discount.at(agentI)=d;
    else
        throw(E("POSG::SetDiscount() discount not valid, should be >=0 and <=1"));
}